

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_new_any(lyd_node *parent,lys_module *module,char *name,void *value,
                  LYD_ANYDATA_VALUETYPE value_type,uint32_t options,lyd_node **node)

{
  ly_ctx *plVar1;
  char *prefix;
  void *name_00;
  lys_module *parent_00;
  uint32_t options_00;
  size_t prefix_len;
  size_t name_len;
  lysc_node *local_c8;
  ly_ctx *local_c0;
  ly_ctx *local_b8;
  ly_ctx *local_b0;
  ly_ctx *local_a0;
  ly_ctx *local_98;
  ly_ctx *local_90;
  ly_ctx *local_88;
  ly_ctx *local_80;
  LY_ERR ret__;
  ly_bool use_value;
  uint32_t getnext_opts;
  ly_ctx *ctx;
  lysc_ext_instance *ext;
  lysc_node *schema;
  lyd_node *ret;
  uint32_t local_40;
  LY_ERR r;
  uint32_t options_local;
  LYD_ANYDATA_VALUETYPE value_type_local;
  void *value_local;
  char *name_local;
  lys_module *module_local;
  lyd_node *parent_local;
  
  schema = (lysc_node *)0x0;
  ctx = (ly_ctx *)0x0;
  if (parent == (lyd_node *)0x0) {
    if (module == (lys_module *)0x0) {
      local_90 = (ly_ctx *)0x0;
    }
    else {
      local_90 = module->ctx;
    }
    local_88 = local_90;
  }
  else {
    if (parent->schema == (lysc_node *)0x0) {
      local_80 = (ly_ctx *)parent[2].schema;
    }
    else {
      local_80 = parent->schema->module->ctx;
    }
    local_88 = local_80;
  }
  options_00 = 0;
  if ((options & 1) != 0) {
    options_00 = 0x10;
  }
  local_40 = options;
  r = value_type;
  _options_local = value;
  value_local = name;
  name_local = (char *)module;
  module_local = (lys_module *)parent;
  if ((parent == (lyd_node *)0x0) && (module == (lys_module *)0x0)) {
    ly_log(local_88,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","parent || module",
           "lyd_new_any");
    parent_local._4_4_ = LY_EINVAL;
  }
  else if ((parent == (lyd_node *)0x0) && (node == (lyd_node **)0x0)) {
    ly_log(local_88,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","parent || node","lyd_new_any")
    ;
    parent_local._4_4_ = LY_EINVAL;
  }
  else if (name == (char *)0x0) {
    ly_log(local_88,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","name","lyd_new_any");
    parent_local._4_4_ = LY_EINVAL;
  }
  else if (((value_type == LYD_ANYDATA_DATATREE) || (value_type == LYD_ANYDATA_STRING)) ||
          (value != (void *)0x0)) {
    if (parent != (lyd_node *)0x0) {
      if (parent->schema == (lysc_node *)0x0) {
        plVar1 = (ly_ctx *)parent[2].schema;
      }
      else {
        plVar1 = parent->schema->module->ctx;
      }
      if (((plVar1 != (ly_ctx *)0x0) && (module != (lys_module *)0x0)) &&
         (module->ctx != (ly_ctx *)0x0)) {
        if (parent == (lyd_node *)0x0) {
          local_a0 = (ly_ctx *)0x0;
        }
        else {
          if (parent->schema == (lysc_node *)0x0) {
            local_98 = (ly_ctx *)parent[2].schema;
          }
          else {
            local_98 = parent->schema->module->ctx;
          }
          local_a0 = local_98;
        }
        if (module == (lys_module *)0x0) {
          local_b0 = (ly_ctx *)0x0;
        }
        else {
          local_b0 = module->ctx;
        }
        if (local_a0 != local_b0) {
          if (parent == (lyd_node *)0x0) {
            local_c0 = (ly_ctx *)0x0;
          }
          else {
            if (parent->schema == (lysc_node *)0x0) {
              local_b8 = (ly_ctx *)parent[2].schema;
            }
            else {
              local_b8 = parent->schema->module->ctx;
            }
            local_c0 = local_b8;
          }
          ly_log(local_c0,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
          return LY_EINVAL;
        }
      }
    }
    if (module == (lys_module *)0x0) {
      name_local = (char *)parent->schema->module;
    }
    if (parent == (lyd_node *)0x0) {
      local_c8 = (lysc_node *)0x0;
    }
    else {
      local_c8 = parent->schema;
    }
    ext = (lysc_ext_instance *)
          lys_find_child(local_c8,(lys_module *)name_local,name,0,0x60,options_00);
    parent_00 = module_local;
    if (((lysc_node *)ext == (lysc_node *)0x0) && (module_local != (lys_module *)0x0)) {
      prefix = *(char **)(name_local + 8);
      prefix_len = strlen(*(char **)(name_local + 8));
      name_00 = value_local;
      name_len = strlen((char *)value_local);
      ret._4_4_ = ly_nested_ext_schema
                            ((lyd_node *)parent_00,(lysc_node *)0x0,prefix,prefix_len,LY_VALUE_JSON,
                             (void *)0x0,(char *)name_00,name_len,(lysc_node **)&ext,
                             (lysc_ext_instance **)&ctx);
      if ((ret._4_4_ != LY_SUCCESS) && (ret._4_4_ != LY_ENOT)) {
        return ret._4_4_;
      }
    }
    if (ext == (lysc_ext_instance *)0x0) {
      ly_log(local_88,LY_LLERR,LY_EINVAL,"Any node \"%s\" not found.",value_local);
      parent_local._4_4_ = LY_ENOTFOUND;
    }
    else {
      parent_local._4_4_ =
           lyd_create_any((lysc_node *)ext,_options_local,r,(options & 0x100) != 0,
                          (lyd_node **)&schema);
      if (parent_local._4_4_ == LY_SUCCESS) {
        if (ctx != (ly_ctx *)0x0) {
          *(uint *)schema->hash = *(uint *)schema->hash | 8;
        }
        if (module_local != (lys_module *)0x0) {
          lyd_insert_node((lyd_node *)module_local,(lyd_node **)0x0,(lyd_node *)schema,0);
        }
        if (node != (lyd_node **)0x0) {
          *node = (lyd_node *)schema;
        }
        parent_local._4_4_ = LY_SUCCESS;
      }
    }
  }
  else {
    ly_log(local_88,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",
           "(value_type == LYD_ANYDATA_DATATREE) || (value_type == LYD_ANYDATA_STRING) || value",
           "lyd_new_any");
    parent_local._4_4_ = LY_EINVAL;
  }
  return parent_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_any(struct lyd_node *parent, const struct lys_module *module, const char *name, const void *value,
        LYD_ANYDATA_VALUETYPE value_type, uint32_t options, struct lyd_node **node)
{
    LY_ERR r;
    struct lyd_node *ret = NULL;
    const struct lysc_node *schema;
    struct lysc_ext_instance *ext = NULL;
    const struct ly_ctx *ctx = parent ? LYD_CTX(parent) : (module ? module->ctx : NULL);
    uint32_t getnext_opts = (options & LYD_NEW_VAL_OUTPUT) ? LYS_GETNEXT_OUTPUT : 0;
    ly_bool use_value = (options & LYD_NEW_ANY_USE_VALUE) ? 1 : 0;

    LY_CHECK_ARG_RET(ctx, parent || module, parent || node, name,
            (value_type == LYD_ANYDATA_DATATREE) || (value_type == LYD_ANYDATA_STRING) || value, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(parent ? LYD_CTX(parent) : NULL, module ? module->ctx : NULL, LY_EINVAL);

    if (!module) {
        module = parent->schema->module;
    }

    schema = lys_find_child(parent ? parent->schema : NULL, module, name, 0, LYD_NODE_ANY, getnext_opts);
    if (!schema && parent) {
        r = ly_nested_ext_schema(parent, NULL, module->name, strlen(module->name), LY_VALUE_JSON, NULL, name,
                strlen(name), &schema, &ext);
        LY_CHECK_RET(r && (r != LY_ENOT), r);
    }
    LY_CHECK_ERR_RET(!schema, LOGERR(ctx, LY_EINVAL, "Any node \"%s\" not found.", name), LY_ENOTFOUND);

    LY_CHECK_RET(lyd_create_any(schema, value, value_type, use_value, &ret));
    if (ext) {
        ret->flags |= LYD_EXT;
    }
    if (parent) {
        lyd_insert_node(parent, NULL, ret, LYD_INSERT_NODE_DEFAULT);
    }

    if (node) {
        *node = ret;
    }
    return LY_SUCCESS;
}